

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

void prometheus::Gateway::CleanupStalePointers
               (vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *collectables)

{
  pointer ppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  iterator __first;
  string *psVar4;
  pointer ppVar5;
  
  ppVar5 = (collectables->
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (collectables->
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = ((long)ppVar1 - (long)ppVar5 >> 4) * -0x5555555555555555 >> 2;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    ppVar5 = ppVar5 + 2;
    do {
      __first._M_current = ppVar5;
      p_Var2 = __first._M_current[-2].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001074ae;
      }
      p_Var2 = __first._M_current[-1].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001074ae;
      }
      p_Var2 = ((__first._M_current)->first).
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) goto LAB_001074ae;
      p_Var2 = __first._M_current[1].first.
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001074ae;
      }
      lVar3 = lVar3 + -1;
      ppVar5 = __first._M_current + 4;
    } while (1 < lVar3);
    ppVar5 = __first._M_current + 2;
  }
  lVar3 = ((long)ppVar1 - (long)ppVar5 >> 4) * -0x5555555555555555;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      __first._M_current = ppVar1;
      if (((lVar3 != 3) ||
          (p_Var2 = (ppVar5->first).
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi, __first._M_current = ppVar5,
          p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
         (p_Var2->_M_use_count == 0)) goto LAB_001074ae;
      ppVar5 = ppVar5 + 1;
    }
    p_Var2 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    __first._M_current = ppVar5;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) goto LAB_001074ae;
    ppVar5 = ppVar5 + 1;
  }
  p_Var2 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  __first._M_current = ppVar5;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var2->_M_use_count != 0)
     ) {
    __first._M_current = ppVar1;
  }
LAB_001074ae:
  if (__first._M_current + 1 != ppVar1 && __first._M_current != ppVar1) {
    psVar4 = (string *)&__first._M_current[1].second;
    do {
      if ((*(long *)(psVar4 + -8) != 0) && (*(int *)(*(long *)(psVar4 + -8) + 8) != 0)) {
        ::std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)
                   __first._M_current,
                   (__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)
                   (psVar4 + -0x10));
        ::std::__cxx11::string::operator=((string *)&(__first._M_current)->second,psVar4);
        __first._M_current = __first._M_current + 1;
      }
      ppVar5 = (pointer)(psVar4 + 0x20);
      psVar4 = psVar4 + 0x30;
    } while (ppVar5 != ppVar1);
  }
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(collectables,__first,
             (collectables->
             super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void Gateway::CleanupStalePointers(
    std::vector<CollectableEntry>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const CollectableEntry& candidate) {
                       return candidate.first.expired();
                     }),
      std::end(collectables));
}